

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void update_square_wave(Channel *channel,u32 total_frames)

{
  byte bVar1;
  u32 uVar2;
  uint uVar3;
  byte bVar4;
  u8 uVar5;
  uint uVar6;
  u8 uVar7;
  
  if ((total_frames != 0) && (channel->status != FALSE)) {
    bVar1 = (channel->envelope).volume;
    uVar3 = (channel->square_wave).ticks;
    uVar2 = channel->accumulator;
    uVar5 = (channel->square_wave).sample;
    do {
      uVar6 = uVar3 >> 1;
      if (total_frames < uVar6) {
        uVar3 = uVar3 + total_frames * -2;
        (channel->square_wave).ticks = uVar3;
        uVar7 = uVar5;
        uVar6 = total_frames;
      }
      else {
        uVar3 = (channel->square_wave).period;
        (channel->square_wave).ticks = uVar3;
        bVar4 = (channel->square_wave).position + 1 & 7;
        (channel->square_wave).position = bVar4;
        uVar7 = update_square_wave::duty[(channel->square_wave).duty][bVar4];
        (channel->square_wave).sample = uVar7;
      }
      uVar2 = uVar2 + (-uVar5 & bVar1) * uVar6;
      total_frames = total_frames - uVar6;
      uVar5 = uVar7;
    } while (total_frames != 0);
    channel->accumulator = uVar2;
  }
  return;
}

Assistant:

static void update_square_wave(Channel* channel, u32 total_frames) {
  static u8 duty[WAVE_DUTY_COUNT][DUTY_CYCLE_COUNT] =
      {[WAVE_DUTY_12_5] = {0, 0, 0, 0, 0, 0, 0, 1},
       [WAVE_DUTY_25] = {1, 0, 0, 0, 0, 0, 0, 1},
       [WAVE_DUTY_50] = {1, 0, 0, 0, 0, 1, 1, 1},
       [WAVE_DUTY_75] = {0, 1, 1, 1, 1, 1, 1, 0}};
  SquareWave* square = &channel->square_wave;
  if (channel->status) {
    while (total_frames) {
      u32 frames = square->ticks / APU_TICKS;
      u8 sample = CHANNELX_SAMPLE(channel, square->sample);
      if (frames <= total_frames) {
        square->ticks = square->period;
        square->position = (square->position + 1) % DUTY_CYCLE_COUNT;
        square->sample = duty[square->duty][square->position];
      } else {
        frames = total_frames;
        square->ticks -= frames * APU_TICKS;
      }
      channel->accumulator += sample * frames;
      total_frames -= frames;
    }
  }
}